

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rply.cpp
# Opt level: O0

int iascii_int16(p_ply ply,double *value)

{
  int iVar1;
  long lVar2;
  double *in_RSI;
  long in_RDI;
  char *end;
  p_ply in_stack_ffffffffffffffd8;
  char *local_20;
  double *local_18;
  long local_10;
  int local_4;
  
  local_18 = in_RSI;
  local_10 = in_RDI;
  iVar1 = ply_read_word(in_stack_ffffffffffffffd8);
  if (iVar1 == 0) {
    local_4 = 0;
  }
  else {
    lVar2 = strtol((char *)(local_10 + 0x4c + *(long *)(local_10 + 0x2058)),&local_20,10);
    *local_18 = (double)lVar2;
    if (((*local_20 != '\0') || (32767.0 < *local_18)) || (*local_18 < -32768.0)) {
      local_4 = 0;
    }
    else {
      local_4 = 1;
    }
  }
  return local_4;
}

Assistant:

static int iascii_int16(p_ply ply, double *value) {
    char *end;
    if (!ply_read_word(ply)) return 0;
    *value = strtol(BWORD(ply), &end, 10);
    if (*end || *value > PLY_INT16_MAX || *value < PLY_INT16_MIN) return 0;
    return 1;
}